

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.h
# Opt level: O0

bool __thiscall wasm::DataFlow::Node::operator==(Node *this,Node *other)

{
  Node *this_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference ppNVar4;
  const_reference ppNVar5;
  uint local_24;
  Index i;
  Node *other_local;
  Node *this_local;
  
  if (this->type == other->type) {
    switch(this->type) {
    case Var:
    case Block:
      return this == other;
    case Expr:
      bVar1 = ExpressionAnalyzer::equal((this->field_1).expr,(other->field_1).expr);
      if (!bVar1) {
        return false;
      }
      break;
    default:
      break;
    case Cond:
      if ((this->field_1).index != (other->field_1).index) {
        return false;
      }
    }
    sVar2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                      (&this->values);
    sVar3 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                      (&other->values);
    if (sVar2 == sVar3) {
      for (local_24 = 0;
          sVar2 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::size
                            (&this->values), local_24 < sVar2; local_24 = local_24 + 1) {
        ppNVar4 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[](&this->values,(ulong)local_24);
        this_00 = *ppNVar4;
        ppNVar5 = std::vector<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>::
                  operator[](&other->values,(ulong)local_24);
        bVar1 = operator!=(this_00,*ppNVar5);
        if (bVar1) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const Node& other) {
    if (type != other.type) {
      return false;
    }
    switch (type) {
      case Var:
      case Block:
        return this == &other;
      case Expr: {
        if (!ExpressionAnalyzer::equal(expr, other.expr)) {
          return false;
        }
        break;
      }
      case Cond: {
        if (index != other.index) {
          return false;
        }
        break;
      }
      default: {}
    }
    if (values.size() != other.values.size()) {
      return false;
    }
    for (Index i = 0; i < values.size(); i++) {
      if (*(values[i]) != *(other.values[i])) {
        return false;
      }
    }
    return true;
  }